

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

void CGL::Collada::ColladaParser::parse_node(XMLElement *xml)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  XMLElement *xml_00;
  XMLElement *xml_01;
  LightInfo *pLVar5;
  size_t sVar6;
  MaterialInfo *pMVar7;
  int i;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  anon_union_32_3_e2189aaa_for_Vector3D_0 aVar10;
  string s_1;
  string name;
  string sid;
  Matrix4x4 mat;
  string s;
  stringstream ss;
  Node node;
  undefined1 *local_5b8 [2];
  undefined1 local_5a8 [16];
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  ios_base *local_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined1 *local_558;
  long local_550;
  undefined1 local_548 [16];
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_538;
  undefined1 local_518 [16];
  double dStack_508;
  double dStack_500;
  undefined1 local_4f8 [16];
  double dStack_4e8;
  double dStack_4e0;
  undefined1 local_4d8 [16];
  double dStack_4c8;
  double dStack_4c0;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  double *local_378;
  double dStack_370;
  double dStack_368;
  double dStack_360;
  double local_358;
  double dStack_350;
  double dStack_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  double dStack_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double dStack_308;
  double dStack_300;
  int local_2f8;
  undefined4 uStack_2f4;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  double *local_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double dStack_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double dStack_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double dStack_268;
  double dStack_260;
  ios_base local_258 [336];
  Node local_108;
  
  Node::Node(&local_108);
  pcVar3 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108,0,(char *)local_108.id._M_string_length,(ulong)pcVar3);
  pcVar3 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.name,0,(char *)local_108.name._M_string_length,(ulong)pcVar3);
  pXVar4 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
  local_578 = local_258;
  do {
    if (pXVar4 == (XMLElement *)0x0) break;
    pcVar3 = tinyxml2::XMLNode::Value(&pXVar4->super_XMLNode);
    std::__cxx11::string::string((string *)local_598,pcVar3,(allocator *)&local_2d8);
    iVar2 = std::__cxx11::string::compare((char *)local_598);
    _local_2f8 = CONCAT44(uStack_2f4,iVar2);
    if (iVar2 == 0) {
      pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&local_378,pcVar3,(allocator *)&local_2d8);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_2d8,(string *)&local_378,_S_out|_S_in);
      _local_4f8 = ZEXT1632(ZEXT816(0) << 0x40);
      local_538 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
      _local_518 = local_538;
      _local_4d8 = _local_4f8;
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,0);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,1);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,2);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,3);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,0);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,1);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,2);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,3);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,2,0);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,2,1);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,2,2);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,2,3);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,3,0);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,3,1);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,3,2);
      std::istream::_M_extract<double>((double *)&local_2d8);
      Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,3,3);
      std::istream::_M_extract<double>((double *)&local_2d8);
      local_108.transform.entries[3].field_0.field_0.x = (double)local_4d8._0_8_;
      local_108.transform.entries[3].field_0.field_0.y = (double)local_4d8._8_8_;
      local_108.transform.entries[3].field_0.field_0.z = dStack_4c8;
      local_108.transform.entries[3].field_0.field_0.w = dStack_4c0;
      local_108.transform.entries[2].field_0.field_0.x = (double)local_4f8._0_8_;
      local_108.transform.entries[2].field_0.field_0.y = (double)local_4f8._8_8_;
      local_108.transform.entries[2].field_0.field_0.z = dStack_4e8;
      local_108.transform.entries[2].field_0.field_0.w = dStack_4e0;
      local_108.transform.entries[1].field_0.field_0.x = (double)local_518._0_8_;
      local_108.transform.entries[1].field_0.field_0.y = (double)local_518._8_8_;
      local_108.transform.entries[1].field_0.field_0.z = dStack_508;
      local_108.transform.entries[1].field_0.field_0.w = dStack_500;
      local_108.transform.entries[0].field_0.field_0.x = local_538.field_0.x;
      local_108.transform.entries[0].field_0.field_0.y = local_538.field_0.y;
      local_108.transform.entries[0].field_0.field_0.z = local_538.field_0.z;
      local_108.transform.entries[0].field_0.field_0.w = local_538.field_0.w;
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_2d8);
      std::ios_base::~ios_base(local_578);
      if (local_378 != &dStack_368) {
        operator_delete(local_378);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_598);
      if (iVar2 == 0) {
        _local_4f8 = ZEXT1632(ZEXT816(0) << 0x40);
        local_538 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        _local_518 = local_538;
        _local_4d8 = _local_4f8;
        pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5b8,pcVar3,(allocator *)&local_2d8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_2d8,(string *)local_5b8,_S_out|_S_in);
        pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"sid",(char *)0x0);
        std::__cxx11::string::string((string *)&local_558,pcVar3,(allocator *)&local_378);
        cVar1 = local_558[local_550 + -1];
        if (cVar1 == 'X') {
          Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,1);
          std::istream::_M_extract<double>((double *)&local_2d8);
          Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,2);
          std::istream::_M_extract<double>((double *)&local_2d8);
          iVar2 = 1;
          i = 2;
LAB_00112e78:
          Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,i,iVar2);
          iVar2 = 2;
          std::istream::_M_extract<double>((double *)&local_2d8);
LAB_00112e90:
          Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,iVar2,iVar2);
          std::istream::_M_extract<double>((double *)&local_2d8);
        }
        else {
          if (cVar1 == 'Y') {
            Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,0);
            std::istream::_M_extract<double>((double *)&local_2d8);
            Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,2,0);
            std::istream::_M_extract<double>((double *)&local_2d8);
            iVar2 = 2;
            i = 0;
            goto LAB_00112e78;
          }
          if (cVar1 == 'Z') {
            Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,0);
            std::istream::_M_extract<double>((double *)&local_2d8);
            Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,1);
            std::istream::_M_extract<double>((double *)&local_2d8);
            Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,0);
            iVar2 = 1;
            std::istream::_M_extract<double>((double *)&local_2d8);
            goto LAB_00112e90;
          }
        }
        Matrix4x4::operator*((Matrix4x4 *)&local_538.field_0,&local_108.transform);
        local_108.transform.entries[3].field_0.field_0.x = local_318;
        local_108.transform.entries[3].field_0.field_0.y = dStack_310;
        local_108.transform.entries[3].field_0.field_0.z = dStack_308;
        local_108.transform.entries[3].field_0.field_0.w = dStack_300;
        local_108.transform.entries[2].field_0.field_0.x = local_338;
        local_108.transform.entries[2].field_0.field_0.y = dStack_330;
        local_108.transform.entries[2].field_0.field_0.z = dStack_328;
        local_108.transform.entries[2].field_0.field_0.w = dStack_320;
        local_108.transform.entries[1].field_0.field_0.x = local_358;
        local_108.transform.entries[1].field_0.field_0.y = dStack_350;
        local_108.transform.entries[1].field_0.field_0.z = dStack_348;
        local_108.transform.entries[1].field_0.field_0.w = dStack_340;
        local_108.transform.entries[0].field_0.field_0.x = (double)local_378;
        local_108.transform.entries[0].field_0.field_0.y = dStack_370;
        local_108.transform.entries[0].field_0.field_0.z = dStack_368;
        local_108.transform.entries[0].field_0.field_0.w = dStack_360;
        if (local_558 != local_548) {
          operator_delete(local_558);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_2d8);
        std::ios_base::~ios_base(local_578);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0]);
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)local_598);
      if (iVar2 == 0) {
        _local_4f8 = ZEXT1632(ZEXT816(0) << 0x40);
        local_538 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        _local_518 = local_538;
        _local_4d8 = _local_4f8;
        pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5b8,pcVar3,(allocator *)&local_2d8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_2d8,(string *)local_5b8,_S_out|_S_in);
        Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,3);
        std::istream::_M_extract<double>((double *)&local_2d8);
        Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,3);
        std::istream::_M_extract<double>((double *)&local_2d8);
        Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,2,3);
        std::istream::_M_extract<double>((double *)&local_2d8);
        Matrix4x4::operator*((Matrix4x4 *)&local_538.field_0,&local_108.transform);
        local_108.transform.entries[3].field_0.field_0.x = local_318;
        local_108.transform.entries[3].field_0.field_0.y = dStack_310;
        local_108.transform.entries[3].field_0.field_0.z = dStack_308;
        local_108.transform.entries[3].field_0.field_0.w = dStack_300;
        local_108.transform.entries[2].field_0.field_0.x = local_338;
        local_108.transform.entries[2].field_0.field_0.y = dStack_330;
        local_108.transform.entries[2].field_0.field_0.z = dStack_328;
        local_108.transform.entries[2].field_0.field_0.w = dStack_320;
        local_108.transform.entries[1].field_0.field_0.x = local_358;
        local_108.transform.entries[1].field_0.field_0.y = dStack_350;
        local_108.transform.entries[1].field_0.field_0.z = dStack_348;
        local_108.transform.entries[1].field_0.field_0.w = dStack_340;
        local_108.transform.entries[0].field_0.field_0.x = (double)local_378;
        local_108.transform.entries[0].field_0.field_0.y = dStack_370;
        local_108.transform.entries[0].field_0.field_0.z = dStack_368;
        local_108.transform.entries[0].field_0.field_0.w = dStack_360;
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_2d8);
        std::ios_base::~ios_base(local_578);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0]);
        }
      }
      iVar2 = std::__cxx11::string::compare((char *)local_598);
      if (iVar2 == 0) {
        _local_4f8 = ZEXT1632(ZEXT816(0) << 0x40);
        local_538 = (anon_union_32_3_e2189aaa_for_Vector4D_0)ZEXT1632(ZEXT816(0) << 0x40);
        _local_518 = local_538;
        _local_4d8 = _local_4f8;
        pcVar3 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)local_5b8,pcVar3,(allocator *)&local_2d8);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_2d8,(string *)local_5b8,_S_out|_S_in);
        Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,0,0);
        std::istream::_M_extract<double>((double *)&local_2d8);
        Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,1);
        std::istream::_M_extract<double>((double *)&local_2d8);
        Matrix4x4::operator()((Matrix4x4 *)&local_538.field_0,1,1);
        std::istream::_M_extract<double>((double *)&local_2d8);
        Matrix4x4::operator*((Matrix4x4 *)&local_538.field_0,&local_108.transform);
        local_108.transform.entries[3].field_0.field_0.x = local_318;
        local_108.transform.entries[3].field_0.field_0.y = dStack_310;
        local_108.transform.entries[3].field_0.field_0.z = dStack_308;
        local_108.transform.entries[3].field_0.field_0.w = dStack_300;
        local_108.transform.entries[2].field_0.field_0.x = local_338;
        local_108.transform.entries[2].field_0.field_0.y = dStack_330;
        local_108.transform.entries[2].field_0.field_0.z = dStack_328;
        local_108.transform.entries[2].field_0.field_0.w = dStack_320;
        local_108.transform.entries[1].field_0.field_0.x = local_358;
        local_108.transform.entries[1].field_0.field_0.y = dStack_350;
        local_108.transform.entries[1].field_0.field_0.z = dStack_348;
        local_108.transform.entries[1].field_0.field_0.w = dStack_340;
        local_108.transform.entries[0].field_0.field_0.x = (double)local_378;
        local_108.transform.entries[0].field_0.field_0.y = dStack_370;
        local_108.transform.entries[0].field_0.field_0.z = dStack_368;
        local_108.transform.entries[0].field_0.field_0.w = dStack_360;
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_2d8);
        std::ios_base::~ios_base(local_578);
        if (local_5b8[0] != local_5a8) {
          operator_delete(local_5b8[0]);
        }
      }
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,(char *)0x0);
    }
    if (local_598[0] != local_588) {
      operator_delete(local_598[0]);
    }
  } while (local_2f8 != 0);
  _local_2f8 = transform._0_8_;
  uStack_2f0 = transform._8_8_;
  uStack_2e8 = transform._16_8_;
  uStack_2e0 = transform._24_8_;
  local_578 = (ios_base *)transform._32_8_;
  uStack_570 = transform._40_8_;
  uStack_568 = transform._48_8_;
  uStack_560 = transform._56_8_;
  local_258[0x130] = (ios_base)transform[0x40];
  local_258[0x131] = (ios_base)transform[0x41];
  local_258[0x132] = (ios_base)transform[0x42];
  local_258[0x133] = (ios_base)transform[0x43];
  local_258[0x134] = (ios_base)transform[0x44];
  local_258[0x135] = (ios_base)transform[0x45];
  local_258[0x136] = (ios_base)transform[0x46];
  local_258[0x137] = (ios_base)transform[0x47];
  local_258[0x138] = (ios_base)transform[0x48];
  local_258[0x139] = (ios_base)transform[0x49];
  local_258[0x13a] = (ios_base)transform[0x4a];
  local_258[0x13b] = (ios_base)transform[0x4b];
  local_258[0x13c] = (ios_base)transform[0x4c];
  local_258[0x13d] = (ios_base)transform[0x4d];
  local_258[0x13e] = (ios_base)transform[0x4e];
  local_258[0x13f] = (ios_base)transform[0x4f];
  local_258[0x140] = (ios_base)transform[0x50];
  local_258[0x141] = (ios_base)transform[0x51];
  local_258[0x142] = (ios_base)transform[0x52];
  local_258[0x143] = (ios_base)transform[0x53];
  local_258[0x144] = (ios_base)transform[0x54];
  local_258[0x145] = (ios_base)transform[0x55];
  local_258[0x146] = (ios_base)transform[0x56];
  local_258[0x147] = (ios_base)transform[0x57];
  local_258[0x148] = (ios_base)transform[0x58];
  local_258[0x149] = (ios_base)transform[0x59];
  local_258[0x14a] = (ios_base)transform[0x5a];
  local_258[0x14b] = (ios_base)transform[0x5b];
  local_258[0x14c] = (ios_base)transform[0x5c];
  local_258[0x14d] = (ios_base)transform[0x5d];
  local_258[0x14e] = (ios_base)transform[0x5e];
  local_258[0x14f] = (ios_base)transform[0x5f];
  local_258[0x110] = (ios_base)transform[0x60];
  local_258[0x111] = (ios_base)transform[0x61];
  local_258[0x112] = (ios_base)transform[0x62];
  local_258[0x113] = (ios_base)transform[99];
  local_258[0x114] = (ios_base)transform[100];
  local_258[0x115] = (ios_base)transform[0x65];
  local_258[0x116] = (ios_base)transform[0x66];
  local_258[0x117] = (ios_base)transform[0x67];
  local_258[0x118] = (ios_base)transform[0x68];
  local_258[0x119] = (ios_base)transform[0x69];
  local_258[0x11a] = (ios_base)transform[0x6a];
  local_258[0x11b] = (ios_base)transform[0x6b];
  local_258[0x11c] = (ios_base)transform[0x6c];
  local_258[0x11d] = (ios_base)transform[0x6d];
  local_258[0x11e] = (ios_base)transform[0x6e];
  local_258[0x11f] = (ios_base)transform[0x6f];
  local_258[0x120] = (ios_base)transform[0x70];
  local_258[0x121] = (ios_base)transform[0x71];
  local_258[0x122] = (ios_base)transform[0x72];
  local_258[0x123] = (ios_base)transform[0x73];
  local_258[0x124] = (ios_base)transform[0x74];
  local_258[0x125] = (ios_base)transform[0x75];
  local_258[0x126] = (ios_base)transform[0x76];
  local_258[0x127] = (ios_base)transform[0x77];
  local_258[0x128] = (ios_base)transform[0x78];
  local_258[0x129] = (ios_base)transform[0x79];
  local_258[0x12a] = (ios_base)transform[0x7a];
  local_258[299] = (ios_base)transform[0x7b];
  local_258[300] = (ios_base)transform[0x7c];
  local_258[0x12d] = (ios_base)transform[0x7d];
  local_258[0x12e] = (ios_base)transform[0x7e];
  local_258[0x12f] = (ios_base)transform[0x7f];
  Matrix4x4::operator*((Matrix4x4 *)transform,&local_108.transform);
  local_108.transform.entries[3].field_0.field_0.x = local_278;
  local_108.transform.entries[3].field_0.field_0.y = dStack_270;
  local_108.transform.entries[3].field_0.field_0.z = dStack_268;
  local_108.transform.entries[3].field_0.field_0.w = dStack_260;
  local_108.transform.entries[2].field_0.field_0.x = local_298;
  local_108.transform.entries[2].field_0.field_0.y = dStack_290;
  local_108.transform.entries[2].field_0.field_0.z = dStack_288;
  local_108.transform.entries[2].field_0.field_0.w = dStack_280;
  local_108.transform.entries[1].field_0.field_0.x = local_2b8;
  local_108.transform.entries[1].field_0.field_0.y = dStack_2b0;
  local_108.transform.entries[1].field_0.field_0.z = dStack_2a8;
  local_108.transform.entries[1].field_0.field_0.w = dStack_2a0;
  local_108.transform.entries[0].field_0.field_0.x = (double)local_2d8;
  local_108.transform.entries[0].field_0.field_0.y = dStack_2d0;
  local_108.transform.entries[0].field_0.field_0.z = dStack_2c8;
  local_108.transform.entries[0].field_0.field_0.w = dStack_2c0;
  transform._0_8_ = local_2d8;
  transform._8_8_ = dStack_2d0;
  transform._16_8_ = dStack_2c8;
  transform._24_8_ = dStack_2c0;
  transform._32_8_ = local_2b8;
  transform._40_8_ = dStack_2b0;
  transform._48_8_ = dStack_2a8;
  transform._56_8_ = dStack_2a0;
  transform._64_8_ = local_298;
  transform._72_8_ = dStack_290;
  transform._80_8_ = dStack_288;
  transform._88_8_ = dStack_280;
  transform._96_8_ = local_278;
  transform._104_8_ = dStack_270;
  transform._112_8_ = dStack_268;
  transform._120_8_ = dStack_260;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"node","");
  pXVar4 = get_element(xml,&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  for (; pXVar4 != (XMLElement *)0x0;
      pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"node")) {
    parse_node(pXVar4);
  }
  transform._0_8_ = _local_2f8;
  transform._8_8_ = uStack_2f0;
  transform._16_8_ = uStack_2e8;
  transform._24_8_ = uStack_2e0;
  transform._32_8_ = local_578;
  transform._40_8_ = uStack_570;
  transform._48_8_ = uStack_568;
  transform._56_8_ = uStack_560;
  transform[0x40] = local_258[0x130];
  transform[0x41] = local_258[0x131];
  transform[0x42] = local_258[0x132];
  transform[0x43] = local_258[0x133];
  transform[0x44] = local_258[0x134];
  transform[0x45] = local_258[0x135];
  transform[0x46] = local_258[0x136];
  transform[0x47] = local_258[0x137];
  transform[0x48] = local_258[0x138];
  transform[0x49] = local_258[0x139];
  transform[0x4a] = local_258[0x13a];
  transform[0x4b] = local_258[0x13b];
  transform[0x4c] = local_258[0x13c];
  transform[0x4d] = local_258[0x13d];
  transform[0x4e] = local_258[0x13e];
  transform[0x4f] = local_258[0x13f];
  transform[0x50] = local_258[0x140];
  transform[0x51] = local_258[0x141];
  transform[0x52] = local_258[0x142];
  transform[0x53] = local_258[0x143];
  transform[0x54] = local_258[0x144];
  transform[0x55] = local_258[0x145];
  transform[0x56] = local_258[0x146];
  transform[0x57] = local_258[0x147];
  transform[0x58] = local_258[0x148];
  transform[0x59] = local_258[0x149];
  transform[0x5a] = local_258[0x14a];
  transform[0x5b] = local_258[0x14b];
  transform[0x5c] = local_258[0x14c];
  transform[0x5d] = local_258[0x14d];
  transform[0x5e] = local_258[0x14e];
  transform[0x5f] = local_258[0x14f];
  transform[0x60] = local_258[0x110];
  transform[0x61] = local_258[0x111];
  transform[0x62] = local_258[0x112];
  transform[99] = local_258[0x113];
  transform[100] = local_258[0x114];
  transform[0x65] = local_258[0x115];
  transform[0x66] = local_258[0x116];
  transform[0x67] = local_258[0x117];
  transform[0x68] = local_258[0x118];
  transform[0x69] = local_258[0x119];
  transform[0x6a] = local_258[0x11a];
  transform[0x6b] = local_258[0x11b];
  transform[0x6c] = local_258[0x11c];
  transform[0x6d] = local_258[0x11d];
  transform[0x6e] = local_258[0x11e];
  transform[0x6f] = local_258[0x11f];
  transform[0x70] = local_258[0x120];
  transform[0x71] = local_258[0x121];
  transform[0x72] = local_258[0x122];
  transform[0x73] = local_258[0x123];
  transform[0x74] = local_258[0x124];
  transform[0x75] = local_258[0x125];
  transform[0x76] = local_258[0x126];
  transform[0x77] = local_258[0x127];
  transform[0x78] = local_258[0x128];
  transform[0x79] = local_258[0x129];
  transform[0x7a] = local_258[0x12a];
  transform[0x7b] = local_258[299];
  transform[0x7c] = local_258[300];
  transform[0x7d] = local_258[0x12d];
  transform[0x7e] = local_258[0x12e];
  transform[0x7f] = local_258[0x12f];
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"instance_camera","");
  pXVar4 = get_element(xml,&local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"instance_light","");
  xml_00 = get_element(xml,&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"instance_geometry","");
  xml_01 = get_element(xml,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (pXVar4 == (XMLElement *)0x0) {
    if (xml_00 == (XMLElement *)0x0) {
      if (xml_01 != (XMLElement *)0x0) {
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"mesh","");
        pXVar4 = get_element(xml_01,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        if (pXVar4 == (XMLElement *)0x0) {
          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"extra","");
          pXVar4 = get_element(xml_01,&local_478);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p);
          }
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001134f5;
          pLVar5 = (LightInfo *)operator_new(0x58);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pLVar5->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(pLVar5->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
          *(undefined1 (*) [32])&(pLVar5->super_Instance).name.field_2 = ZEXT1632(auVar8);
          (pLVar5->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar5->super_Instance).id.field_2;
          (pLVar5->super_Instance).id._M_string_length = 0;
          (pLVar5->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar5->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar5->super_Instance).name.field_2;
          (pLVar5->super_Instance).name._M_string_length = 0;
          (pLVar5->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_sphere(xml_01,(SphereInfo *)pLVar5);
          local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_498,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar4 = get_element(xml,&local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p);
          }
          local_108.instance = (Instance *)pLVar5;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001134f5;
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar3 == (char *)0x0) goto LAB_001139ab;
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          local_2d8 = &dStack_2c8;
          sVar6 = strlen(pcVar3 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,pcVar3 + 1,pcVar3 + sVar6 + 1);
          local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4b8,local_2d8,(long)dStack_2d0 + (long)local_2d8);
          pXVar4 = uri_find(&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
            operator_delete(local_4b8._M_dataplus._M_p);
          }
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001139ab;
          pMVar7 = (MaterialInfo *)operator_new(0x50);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pMVar7->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(pMVar7->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
          *(undefined1 (*) [32])&(pMVar7->super_Instance).name._M_string_length = ZEXT1632(auVar8);
          (pMVar7->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar7->super_Instance).id.field_2;
          (pMVar7->super_Instance).id._M_string_length = 0;
          (pMVar7->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar7->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar7->super_Instance).name.field_2;
          (pMVar7->super_Instance).name._M_string_length = 0;
          (pMVar7->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar7);
          *(MaterialInfo **)&(pLVar5->spectrum).field_0 = pMVar7;
        }
        else {
          pLVar5 = (LightInfo *)operator_new(0xb0);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pLVar5->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(pLVar5->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
          aVar10 = (anon_union_32_3_e2189aaa_for_Vector3D_0)ZEXT1632(auVar8);
          *(anon_union_32_3_e2189aaa_for_Vector3D_0 *)((long)&(pLVar5->spectrum).field_0 + 0x10) =
               aVar10;
          *(anon_union_32_3_e2189aaa_for_Vector3D_0 *)
           ((long)&(pLVar5->super_Instance).name.field_2 + 8) = aVar10;
          *(anon_union_32_3_e2189aaa_for_Vector3D_0 *)((long)&(pLVar5->position).field_0 + 0x10) =
               aVar10;
          (pLVar5->direction).field_0 = aVar10;
          (pLVar5->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pLVar5->super_Instance).id.field_2;
          (pLVar5->super_Instance).id._M_string_length = 0;
          (pLVar5->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pLVar5->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pLVar5->super_Instance).name.field_2;
          (pLVar5->super_Instance).name._M_string_length = 0;
          (pLVar5->super_Instance).name.field_2._M_local_buf[0] = '\0';
          auVar9 = ZEXT1632(auVar8);
          *(undefined1 (*) [32])&pLVar5->light_type = auVar9;
          *(undefined1 (*) [32])((long)&(pLVar5->spectrum).field_0 + 0x18) = auVar9;
          *(undefined1 (*) [32])((long)&(pLVar5->position).field_0 + 0x18) = auVar9;
          parse_polymesh(xml_01,(PolymeshInfo *)pLVar5);
          local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_438,
                     "instance_geometry/bind_material/technique_common/instance_material","");
          pXVar4 = get_element(xml,&local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_dataplus._M_p != &local_438.field_2) {
            operator_delete(local_438._M_dataplus._M_p);
          }
          local_108.instance = (Instance *)pLVar5;
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001134f5;
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          if (pcVar3 == (char *)0x0) {
LAB_001139ab:
            exit(1);
          }
          pcVar3 = tinyxml2::XMLElement::Attribute(pXVar4,"target",(char *)0x0);
          local_2d8 = &dStack_2c8;
          sVar6 = strlen(pcVar3 + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d8,pcVar3 + 1,pcVar3 + sVar6 + 1);
          local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_458,local_2d8,(long)dStack_2d0 + (long)local_2d8);
          pXVar4 = uri_find(&local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_dataplus._M_p != &local_458.field_2) {
            operator_delete(local_458._M_dataplus._M_p);
          }
          if (pXVar4 == (XMLElement *)0x0) goto LAB_001139ab;
          pMVar7 = (MaterialInfo *)operator_new(0x50);
          auVar8 = ZEXT816(0) << 0x40;
          *(undefined1 (*) [32])&pMVar7->super_Instance = ZEXT1632(auVar8);
          *(undefined1 (*) [32])((long)&(pMVar7->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
          *(undefined1 (*) [32])&(pMVar7->super_Instance).name._M_string_length = ZEXT1632(auVar8);
          (pMVar7->super_Instance).id._M_dataplus._M_p =
               (pointer)&(pMVar7->super_Instance).id.field_2;
          (pMVar7->super_Instance).id._M_string_length = 0;
          (pMVar7->super_Instance).id.field_2._M_local_buf[0] = '\0';
          (pMVar7->super_Instance).name._M_dataplus._M_p =
               (pointer)&(pMVar7->super_Instance).name.field_2;
          (pMVar7->super_Instance).name._M_string_length = 0;
          (pMVar7->super_Instance).name.field_2._M_local_buf[0] = '\0';
          parse_material(pXVar4,pMVar7);
          *(MaterialInfo **)((long)&(pLVar5->direction).field_0 + 0x18) = pMVar7;
        }
        local_108.instance = &pLVar5->super_Instance;
        if (local_2d8 != &dStack_2c8) {
          operator_delete(local_2d8);
        }
      }
    }
    else {
      pLVar5 = (LightInfo *)operator_new(0xf0);
      LightInfo::LightInfo(pLVar5);
      parse_light(xml_00,pLVar5);
      local_108.instance = (Instance *)pLVar5;
    }
  }
  else {
    pLVar5 = (LightInfo *)operator_new(0xa0);
    auVar8 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])&pLVar5->super_Instance = ZEXT1632(auVar8);
    *(undefined1 (*) [32])((long)&(pLVar5->super_Instance).id.field_2 + 8) = ZEXT1632(auVar8);
    auVar9 = ZEXT1632(auVar8);
    *(undefined1 (*) [32])((long)&(pLVar5->super_Instance).name.field_2 + 8) = auVar9;
    *(undefined1 (*) [32])((long)&(pLVar5->spectrum).field_0 + 0x10) = auVar9;
    *(undefined1 (*) [32])((long)&(pLVar5->position).field_0 + 0x10) = auVar9;
    (pLVar5->super_Instance).id._M_dataplus._M_p = (pointer)&(pLVar5->super_Instance).id.field_2;
    (pLVar5->super_Instance).id._M_string_length = 0;
    (pLVar5->super_Instance).id.field_2._M_local_buf[0] = '\0';
    (pLVar5->super_Instance).name._M_dataplus._M_p = (pointer)&(pLVar5->super_Instance).name.field_2
    ;
    (pLVar5->super_Instance).name._M_string_length = 0;
    (pLVar5->super_Instance).name.field_2._M_local_buf[0] = '\0';
    *(undefined1 (*) [16])(pLVar5->spectrum).field_0.field_2.__vec = ZEXT416(0) << 0x40;
    (pLVar5->spectrum).field_0.field_0.z = 0.0;
    *(undefined1 (*) [16])(pLVar5->position).field_0.field_2.__vec = ZEXT416(0) << 0x40;
    (pLVar5->position).field_0.field_0.z = 0.0;
    parse_camera(pXVar4,(CameraInfo *)pLVar5);
    local_108.instance = (Instance *)pLVar5;
  }
LAB_001134f5:
  std::vector<CGL::Collada::Node,_std::allocator<CGL::Collada::Node>_>::push_back(scene,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
    operator_delete(local_108.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.id._M_dataplus._M_p != &local_108.id.field_2) {
    operator_delete(local_108.id._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ColladaParser::parse_node( XMLElement* xml ) {

  // create new node
  Node node = Node();

  // name & id
  node.id   = xml->Attribute( "id" );
  node.name = xml->Attribute("name");
  stat(" |- Node: " << node.name << " (id:" << node.id << ")");

  // node transformation -
  // combine in order of declaration if the transformations are given as a
  // transformation list
  XMLElement* e = xml->FirstChildElement();
  while (e) {

    string name = e->Name();

    // transformation - matrix
    if (name == "matrix") {

      string s = e->GetText();
      stringstream ss (s);

      Matrix4x4 mat;
      ss >> mat(0,0); ss >> mat(0,1); ss >> mat(0,2); ss >> mat(0,3);
      ss >> mat(1,0); ss >> mat(1,1); ss >> mat(1,2); ss >> mat(1,3);
      ss >> mat(2,0); ss >> mat(2,1); ss >> mat(2,2); ss >> mat(2,3);
      ss >> mat(3,0); ss >> mat(3,1); ss >> mat(3,2); ss >> mat(3,3);

      node.transform = mat; break;

    }

    // transformation - rotate
    if (name == "rotate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      string sid = e->Attribute("sid");
      switch (sid.back()) {
        case 'X':
          ss >> m(1,1); ss >> m(1,2);
          ss >> m(2,1); ss >> m(2,2);
          break;
        case 'Y':
          ss >> m(0,0); ss >> m(2,0);
          ss >> m(0,2); ss >> m(2,2);
          break;
        case 'Z':
          ss >> m(0,0); ss >> m(0,1);
          ss >> m(1,0); ss >> m(1,1);
          break;
        default:
          break;
      }

      node.transform = m * node.transform;

    }

    // transformation - translate
    if (name == "translate") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,3); ss >> m(1,3); ss >> m(2,3);

      node.transform = m * node.transform;
    }

    // transformation - scale
    if (name == "scale") {

      Matrix4x4 m;

      string s = e->GetText();
      stringstream ss (s);

      ss >> m(0,0); ss >> m(1,1); ss >> m(1,1);

      node.transform = m * node.transform;
    }

    // transformation - skew
    // Note (sky): ignored for now

    // transformation - lookat
    // Note (sky): ignored for now

    e = e->NextSiblingElement();
  }

  // push transformations
  Matrix4x4 transform_save = transform;

  // combine transformations
  node.transform = transform * node.transform;
  transform = node.transform;

  // parse child nodes if node is a joint
  XMLElement* e_child = get_element(xml, "node");
  while (e_child) {
    parse_node(e_child);
    e_child = e_child->NextSiblingElement("node");
  }

  // pop transformations
  transform = transform_save;

  // node instance -
  // non-joint nodes must contain a scene object instance
  XMLElement* e_camera   = get_element(xml, "instance_camera");
  XMLElement* e_light    = get_element(xml, "instance_light");
  XMLElement* e_geometry = get_element(xml, "instance_geometry");

  if (e_camera) {
    CameraInfo* camera = new CameraInfo();
    parse_camera( e_camera, *camera );
    node.instance = camera;
  } else if (e_light) {
    LightInfo* light = new LightInfo();
    parse_light( e_light, *light );
    node.instance = light;
  } else if (e_geometry) {
    if (get_element(e_geometry, "mesh")) {

      // mesh geometry
      PolymeshInfo* polymesh = new PolymeshInfo();
      parse_polymesh(e_geometry, *polymesh);

      // mesh material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        polymesh->material = material;
      }

      node.instance = polymesh;

    } else if (get_element(e_geometry, "extra")) {

      // sphere geometry
      SphereInfo* sphere = new SphereInfo();
      parse_sphere(e_geometry, *sphere);

      // sphere material
      XMLElement* e_instance_material = get_element(xml,
      "instance_geometry/bind_material/technique_common/instance_material");
      if (e_instance_material) {

        if (!e_instance_material->Attribute("target")) {
          stat("Error: no target material in instance: " << e_instance_material);
          exit(EXIT_FAILURE);
        }

        string material_id = e_instance_material->Attribute("target") + 1;
        XMLElement* e_material = uri_find(material_id);
        if (!e_material) {
          stat("Error: invalid target material id : " << material_id);
          exit(EXIT_FAILURE);
        }

        MaterialInfo* material = new MaterialInfo();
        parse_material(e_material, *material);
        sphere->material = material;
      }

      node.instance = sphere;

    }
  }

  // add node to scene
  scene->nodes.push_back(node);
}